

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_METAL_uniform(Context *ctx,RegisterType regtype,int regnum,VariableList *var)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  size_t in_R8;
  ulong uVar5;
  char name [64];
  char varname [64];
  char acStack_a8 [64];
  char local_68 [64];
  
  if ((REG_TYPE_CONSTBOOL < regtype) ||
     ((0x4084U >> (regtype & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) == 0)) {
    failf(ctx,"%s","BUG: used a uniform we don\'t know how to define.");
  }
  pcVar2 = get_D3D_register_string(ctx,regtype,regnum,acStack_a8,in_R8);
  snprintf(local_68,0x40,"%s%s",pcVar2,acStack_a8);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  if (var == (VariableList *)0x0) {
    get_METAL_uniform_array_varname(ctx,regtype,acStack_a8,(size_t)pcVar2);
    if (regtype == REG_TYPE_CONSTBOOL) {
      uVar5 = (ulong)(uint)ctx->uniform_bool_count;
    }
    else if (regtype == REG_TYPE_CONSTINT) {
      uVar5 = (ulong)(uint)ctx->uniform_int4_count;
    }
    else if (regtype == REG_TYPE_CONST) {
      uVar5 = (ulong)(uint)ctx->uniform_float4_count;
    }
    else {
      uVar5 = 0;
      if (ctx->isfail == 0) {
        __assert_fail("isfail(ctx)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x12a2,
                      "void emit_METAL_uniform(Context *, RegisterType, int, const VariableList *)")
        ;
      }
    }
    pcVar2 = "#define %s %s[%d]";
  }
  else {
    uVar4 = var->index;
    if (var->constant == (ConstantsList *)0x0) {
      if (var->emit_position == -1) {
        __assert_fail("var->emit_position != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x12b8,
                      "void emit_METAL_uniform(Context *, RegisterType, int, const VariableList *)")
        ;
      }
      get_METAL_uniform_array_varname(ctx,regtype,acStack_a8,(size_t)pcVar2);
      uVar4 = (regnum - uVar4) + var->emit_position;
    }
    else {
      snprintf(acStack_a8,0x40,"const_array_%d_%d",(ulong)uVar4,(ulong)(uint)var->count);
      uVar4 = regnum - uVar4;
    }
    pcVar2 = "#define %s %s[%d];";
    uVar5 = (ulong)uVar4;
  }
  output_line(ctx,pcVar2,local_68,acStack_a8,uVar5);
  push_output(ctx,&ctx->mainline);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"#undef %s",local_68);
  iVar1 = ctx->output_stack_len;
  if (0 < iVar1) {
    lVar3 = (long)iVar1;
    ctx->output_stack_len = iVar1 - 1U;
    ctx->output = ctx->output_stack[iVar1 - 1U];
    ctx->indent = ctx->indent_stack[lVar3 + -1];
    if (0 < lVar3 + -1) {
      ctx->output_stack_len = (int)(lVar3 - 2U);
      ctx->output = ctx->output_stack[lVar3 - 2U & 0xffffffff];
      ctx->indent = ctx->indent_stack[lVar3 + -2];
      return;
    }
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_METAL_uniform(Context *ctx, RegisterType regtype, int regnum,
                              const VariableList *var)
{
    // Now that we're pushing all the uniforms as one struct, pack these
    //  down, so if we only use register c439, it'll actually map to
    //  uniforms.uniforms_float4[0]. As we push one big struct, this will
    //  prevent uploading unused data.

    const char *utype = get_METAL_uniform_type(ctx, regtype);
    char varname[64];
    char name[64];
    int index = 0;

    get_METAL_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;

    if (var == NULL)
    {
        get_METAL_uniform_array_varname(ctx, regtype, name, sizeof (name));

        if (regtype == REG_TYPE_CONST)
            index = ctx->uniform_float4_count;
        else if (regtype == REG_TYPE_CONSTINT)
            index = ctx->uniform_int4_count;
        else if (regtype == REG_TYPE_CONSTBOOL)
            index = ctx->uniform_bool_count;
        else  // get_METAL_uniform_array_varname() would have called fail().
            assert(isfail(ctx));

        // !!! FIXME: can cause unused var warnings in Clang...
        //output_line(ctx, "constant %s &%s = %s[%d];", utype, varname, name, index);
        output_line(ctx, "#define %s %s[%d]", varname, name, index);
        push_output(ctx, &ctx->mainline);
        ctx->indent++;
        output_line(ctx, "#undef %s", varname);  // !!! FIXME: gross.
        pop_output(ctx);
    } // if

    else
    {
        const int arraybase = var->index;
        if (var->constant)
        {
            get_METAL_const_array_varname_in_buf(ctx, arraybase, var->count,
                                                name, sizeof (name));
            index = (regnum - arraybase);
        } // if
        else
        {
            assert(var->emit_position != -1);
            get_METAL_uniform_array_varname(ctx, regtype, name, sizeof (name));
            index = (regnum - arraybase) + var->emit_position;
        } // else

        // !!! FIXME: might trigger unused var warnings in Clang.
        //output_line(ctx, "constant %s &%s = %s[%d];", utype, varname, name, index);
        output_line(ctx, "#define %s %s[%d];", varname, name, index);
        push_output(ctx, &ctx->mainline);
        ctx->indent++;
        output_line(ctx, "#undef %s", varname);  // !!! FIXME: gross.
        pop_output(ctx);
    } // else

    pop_output(ctx);
}